

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  pointer pSVar3;
  pointer pcVar4;
  ostream *poVar5;
  undefined1 local_128 [64];
  SummaryColumn local_e8;
  undefined1 auStack_a8 [8];
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  columns;
  string local_88 [56];
  string local_50;
  allocator local_29;
  
  sVar1 = (totals->testCases).failed;
  sVar2 = (totals->testCases).failedButOk;
  if ((totals->testCases).passed + sVar1 + sVar2 == 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)columns.
                          super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ << 8);
    Colour::use(ReconstructedExpression);
    std::operator<<(poVar5,"No tests ran\n");
    Colour::~Colour((Colour *)
                    &columns.
                     super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else if ((sVar2 == 0 && sVar1 == 0) &&
          ((totals->assertions).failed + (totals->assertions).passed !=
           -(totals->assertions).failedButOk)) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)columns.
                          super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ << 8);
    Colour::use(BrightGreen);
    std::operator<<(poVar5,"All tests passed");
    Colour::~Colour((Colour *)
                    &columns.
                     super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    pSVar3 = (pointer)(totals->assertions).passed;
    std::__cxx11::string::string((string *)&local_e8,"assertion",(allocator *)auStack_a8);
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3;
    std::__cxx11::string::string(local_88,(string *)&local_e8);
    operator<<(poVar5,(pluralise *)
                      &columns.
                       super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<(poVar5," in ");
    pcVar4 = (pointer)(totals->testCases).passed;
    std::__cxx11::string::string((string *)&local_50,"test case",&local_29);
    local_128._0_8_ = pcVar4;
    std::__cxx11::string::string((string *)(local_128 + 8),(string *)&local_50);
    operator<<(poVar5,(pluralise *)local_128);
    poVar5 = std::operator<<(poVar5,")");
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)(local_128 + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    auStack_a8 = (undefined1  [8])0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_50,"",&local_29);
    SummaryColumn::SummaryColumn(&local_e8,&local_50,None);
    SummaryColumn::addRow
              ((SummaryColumn *)local_128,&local_e8,
               (totals->testCases).failed + (totals->testCases).passed +
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(SummaryColumn *)local_128,
               (totals->assertions).failed + (totals->assertions).passed +
               (totals->assertions).failedButOk);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_a8,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_128);
    SummaryColumn::~SummaryColumn(&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"passed",&local_29);
    SummaryColumn::SummaryColumn(&local_e8,&local_50,Green);
    SummaryColumn::addRow((SummaryColumn *)local_128,&local_e8,(totals->testCases).passed);
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(SummaryColumn *)local_128,
               (totals->assertions).passed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_a8,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_128);
    SummaryColumn::~SummaryColumn(&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"failed",&local_29);
    SummaryColumn::SummaryColumn(&local_e8,&local_50,BrightRed);
    SummaryColumn::addRow((SummaryColumn *)local_128,&local_e8,(totals->testCases).failed);
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(SummaryColumn *)local_128,
               (totals->assertions).failed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_a8,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_128);
    SummaryColumn::~SummaryColumn(&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"failed as expected",&local_29);
    SummaryColumn::SummaryColumn(&local_e8,&local_50,ReconstructedExpression);
    SummaryColumn::addRow((SummaryColumn *)local_128,&local_e8,(totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(SummaryColumn *)local_128,
               (totals->assertions).failedButOk);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_a8,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_128);
    SummaryColumn::~SummaryColumn(&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string
              ((string *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"test cases",
               (allocator *)local_128);
    printSummaryRow(this,(string *)
                         &columns.
                          super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     *)auStack_a8,0);
    std::__cxx11::string::~string
              ((string *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string
              ((string *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"assertions",
               (allocator *)local_128);
    printSummaryRow(this,(string *)
                         &columns.
                          super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     *)auStack_a8,1);
    std::__cxx11::string::~string
              ((string *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::~vector((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
               *)auStack_a8);
  }
  return;
}

Assistant:

void printTotals( Totals const& totals ) {
            if( totals.testCases.total() == 0 ) {
                stream << Colour( Colour::Warning ) << "No tests ran\n";
            }
            else if( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
                stream << Colour( Colour::ResultSuccess ) << "All tests passed";
                stream << " ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")"
                        << "\n";
            }
            else {

                std::vector<SummaryColumn> columns;
                columns.push_back( SummaryColumn( "", Colour::None )
                                        .addRow( totals.testCases.total() )
                                        .addRow( totals.assertions.total() ) );
                columns.push_back( SummaryColumn( "passed", Colour::Success )
                                        .addRow( totals.testCases.passed )
                                        .addRow( totals.assertions.passed ) );
                columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                                        .addRow( totals.testCases.failed )
                                        .addRow( totals.assertions.failed ) );
                columns.push_back( SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                                        .addRow( totals.testCases.failedButOk )
                                        .addRow( totals.assertions.failedButOk ) );

                printSummaryRow( "test cases", columns, 0 );
                printSummaryRow( "assertions", columns, 1 );
            }
        }